

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

char * __thiscall
gl3cts::TransformFeedbackOverflowQuerySingleStreamBase::transformFeedbackVertexShader
          (TransformFeedbackOverflowQuerySingleStreamBase *this)

{
  TransformFeedbackOverflowQuerySingleStreamBase *this_local;
  
  return 
  "#version 150 core\nout float output1;\nout float output2;\nout float output3;\nout float output4;\nvoid main() {\n    output1 = 1.0;\n    output2 = 2.0;\n    output3 = 3.0;\n    output4 = 4.0;\n}"
  ;
}

Assistant:

virtual const char* transformFeedbackVertexShader()
	{
		return "#version 150 core\n"
			   "out float output1;\n"
			   "out float output2;\n"
			   "out float output3;\n"
			   "out float output4;\n"
			   "void main() {\n"
			   "    output1 = 1.0;\n"
			   "    output2 = 2.0;\n"
			   "    output3 = 3.0;\n"
			   "    output4 = 4.0;\n"
			   "}";
	}